

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

int __thiscall
sqvector<SQClassMember>::copy(sqvector<SQClassMember> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long *plVar1;
  uint uVar2;
  SQClassMember *pSVar3;
  long lVar4;
  long lVar5;
  SQClassMember *in_RAX;
  SQClassMember *extraout_RAX;
  ulong uVar6;
  ulong uVar7;
  SQClassMember local_38;
  
  if (this->_size != 0) {
    local_38.val.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_38.attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_38.val.super_SQObject._type = OT_NULL;
    local_38.val.super_SQObject._4_4_ = 0;
    local_38.attrs.super_SQObject._type = OT_NULL;
    local_38.attrs.super_SQObject._4_4_ = 0;
    resize(this,0,&local_38);
    SQObjectPtr::~SQObjectPtr(&local_38.attrs);
    SQObjectPtr::~SQObjectPtr(&local_38.val);
    in_RAX = extraout_RAX;
  }
  uVar7 = *(ulong *)(dst + 8);
  if (this->_allocated < uVar7) {
    in_RAX = (SQClassMember *)sq_vm_realloc(this->_vals,this->_allocated << 5,uVar7 << 5);
    this->_vals = in_RAX;
    this->_allocated = uVar7;
    uVar7 = *(ulong *)(dst + 8);
  }
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    in_RAX = (SQClassMember *)0x18;
    uVar6 = 0;
    do {
      pSVar3 = this->_vals;
      lVar4 = *(long *)dst;
      uVar2 = *(uint *)(lVar4 + -0x18 + (long)in_RAX);
      *(uint *)((long)&pSVar3[-1].val.super_SQObject._unVal + (long)in_RAX) = uVar2;
      lVar5 = *(long *)(lVar4 + -0x10 + (long)in_RAX);
      *(long *)((long)&pSVar3[-1].attrs.super_SQObject._type + (long)&(in_RAX->val).super_SQObject)
           = lVar5;
      if ((uVar2 >> 0x1b & 1) != 0) {
        plVar1 = (long *)(lVar5 + 8);
        *plVar1 = *plVar1 + 1;
      }
      uVar2 = *(uint *)(lVar4 + -8 + (long)in_RAX);
      *(uint *)((long)&pSVar3[-1].attrs.super_SQObject._unVal + (long)in_RAX) = uVar2;
      lVar4 = *(long *)((long)&(in_RAX->val).super_SQObject._type + lVar4);
      *(long *)((long)&(in_RAX->val).super_SQObject._type +
               (long)&(pSVar3->val).super_SQObject._type) = lVar4;
      if ((uVar2 >> 0x1b & 1) != 0) {
        plVar1 = (long *)(lVar4 + 8);
        *plVar1 = *plVar1 + 1;
      }
      uVar6 = uVar6 + 1;
      uVar7 = *(ulong *)(dst + 8);
      in_RAX = in_RAX + 1;
    } while (uVar6 < uVar7);
  }
  this->_size = uVar7;
  return (int)in_RAX;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }